

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O3

Vector * ChebyshevIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                      double OmegaPrecond)

{
  bool bVar1;
  Boolean BVar2;
  LASErrIdType LVar3;
  size_t Dim;
  Vector *pVVar4;
  Vector *pVVar5;
  int iVar6;
  double bNorm;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  Vector r;
  Vector p;
  Vector z;
  double local_118;
  double local_108;
  double local_100;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_c0,"r",Dim,Normal,True);
  V_Constr(&local_90,"p",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Constr(&local_60,"z",Dim,Normal,True);
  }
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar7 = GetMaxEigenval(A,PrecondProc,OmegaPrecond);
    dVar8 = GetMinEigenval(A,PrecondProc,OmegaPrecond);
    dVar9 = l1Norm_V(x);
    auVar10._8_4_ = (int)(Dim >> 0x20);
    auVar10._0_8_ = Dim;
    auVar10._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    dVar9 = (dVar7 - dVar8) * 0.5;
    dVar7 = (dVar7 + dVar8) * 0.5;
    Asgn_VV(&local_c0,pVVar4);
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar2 = Q_KerDefined(A), BVar2 == False)) {
      dVar8 = l2Norm_V(&local_c0);
      BVar2 = RTCResult(0,dVar8,bNorm,ChebyshevIterId);
      if ((0 < MaxIter) && (BVar2 == False)) {
        local_118 = 0.0;
        local_108 = 0.0;
        iVar6 = 1;
        do {
          if (iVar6 == 1) {
            pVVar4 = Mul_SV(1.0 / dVar7,&local_c0);
            local_108 = 1.0;
            local_118 = dVar7 / dVar9;
          }
          else {
            dVar11 = ((dVar7 + dVar7) / dVar9) * local_118;
            dVar8 = dVar11 - local_108;
            pVVar4 = Mul_SV(((2.0 / dVar9) * local_118) / dVar8,&local_c0);
            pVVar5 = Mul_SV(dVar11 / dVar8 + -1.0,&local_90);
            pVVar4 = Add_VV(pVVar4,pVVar5);
            local_108 = local_118;
            local_118 = dVar8;
          }
          Asgn_VV(&local_90,pVVar4);
          AddAsgn_VV(x,&local_90);
          if (iVar6 < MaxIter) {
            pVVar4 = Mul_QV(A,x);
            pVVar4 = Sub_VV(b,pVVar4);
            Asgn_VV(&local_c0,pVVar4);
          }
          dVar8 = l2Norm_V(&local_c0);
          BVar2 = RTCResult(iVar6,dVar8,bNorm,ChebyshevIterId);
        } while ((iVar6 < MaxIter) && (iVar6 = iVar6 + 1, BVar2 == False));
      }
    }
    else {
      dVar8 = l2Norm_V(&local_c0);
      BVar2 = RTCResult(0,dVar8,bNorm,ChebyshevIterId);
      if (0 < MaxIter && BVar2 == False) {
        local_100 = 0.0;
        local_118 = 0.0;
        iVar6 = 1;
        dVar8 = local_118;
        do {
          local_118 = dVar8;
          if (PrecondProc == (PrecondProcType)0x0) {
            Asgn_VV(&local_60,&local_c0);
          }
          else {
            (*PrecondProc)(A,&local_60,&local_c0,OmegaPrecond);
          }
          BVar2 = Q_KerDefined(A);
          if (BVar2 != False) {
            OrthoRightKer_VQ(&local_60,A);
          }
          if (iVar6 == 1) {
            pVVar4 = Mul_SV(1.0 / dVar7,&local_60);
            local_118 = 1.0;
            local_108 = dVar7 / dVar9;
          }
          else {
            dVar8 = ((dVar7 + dVar7) / dVar9) * local_118;
            local_108 = dVar8 - local_100;
            pVVar4 = Mul_SV(((2.0 / dVar9) * local_118) / local_108,&local_60);
            pVVar5 = Mul_SV(dVar8 / local_108 + -1.0,&local_90);
            pVVar4 = Add_VV(pVVar4,pVVar5);
          }
          Asgn_VV(&local_90,pVVar4);
          AddAsgn_VV(x,&local_90);
          if (iVar6 < MaxIter) {
            pVVar4 = Mul_QV(A,x);
            pVVar4 = Sub_VV(b,pVVar4);
            Asgn_VV(&local_c0,pVVar4);
          }
          dVar8 = l2Norm_V(&local_c0);
          BVar2 = RTCResult(iVar6,dVar8,bNorm,ChebyshevIterId);
          if (BVar2 != False) break;
          bVar1 = iVar6 < MaxIter;
          iVar6 = iVar6 + 1;
          dVar8 = local_108;
          local_100 = local_118;
        } while (bVar1);
      }
    }
    BVar2 = Q_KerDefined(A);
    if (BVar2 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&local_c0);
  V_Destr(&local_90);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Destr(&local_60);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *ChebyshevIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     *  The original algorithm doesn't seem to work correctly.
     *  The three term recursion was therefore in the curent version
     *  adopted after
     *
     *  W. Hackbusch: 
     *  Iterative Solution of Large Sparse Systems of Equations,
     *  Springer-Verlag, Berlin, 1994
     *
     */
     
    int Iter;
    double MaxEigenval, MinEigenval;
    double c, d, Alpha, Beta;
    double T = 0.0, TOld = 0.0, TNew; /* values of Chebyshev polynomials */
    double bNorm;
    size_t Dim;
    Vector r, p, z;
    

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        MaxEigenval = GetMaxEigenval(A, PrecondProc, OmegaPrecond);
        MinEigenval = GetMinEigenval(A, PrecondProc, OmegaPrecond);

        c = (MaxEigenval - MinEigenval) / 2.0;
        d = (MaxEigenval + MinEigenval) / 2.0;
	
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned Chebyshev method */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&z, A);
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &z));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &z), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        } else {
            /* plain Chebyshev method (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &r));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &r), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&p);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}